

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyFileCreatorByType.cpp
# Opt level: O3

void ApprovalTests::EmptyFileCreatorByType::createFile(string *fileName)

{
  pointer pcVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  if (creators__abi_cxx11_._24_8_ != 0x17cd20) {
    p_Var3 = (_Rb_tree_node_base *)creators__abi_cxx11_._24_8_;
    do {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar1 = (fileName->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + fileName->_M_string_length);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,*(long *)(p_Var3 + 1),
                 (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
      bVar2 = StringUtils::endsWith(&local_b0,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (bVar2) {
        paVar5 = &local_80;
        pcVar1 = (fileName->_M_dataplus)._M_p;
        local_90[0] = paVar5;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_90,pcVar1,pcVar1 + fileName->_M_string_length);
        if (p_Var3[2]._M_left == (_Base_ptr)0x0) {
          ::std::__throw_bad_function_call();
        }
        (*(code *)p_Var3[2]._M_right)(p_Var3 + 2,local_90);
        _Var4._M_p = (pointer)local_90[0];
        goto LAB_0012f632;
      }
      p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)(creators__abi_cxx11_ + 8));
  }
  paVar5 = &local_50.field_2;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)paVar5;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + fileName->_M_string_length);
  EmptyFileCreatorFactory::defaultCreator(&local_50);
  _Var4._M_p = local_50._M_dataplus._M_p;
LAB_0012f632:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar5) {
    operator_delete(_Var4._M_p);
  }
  return;
}

Assistant:

void EmptyFileCreatorByType::createFile(const std::string& fileName)
    {
        for (const auto& creator : creators_)
        {
            if (StringUtils::endsWith(fileName, creator.first))
            {
                creator.second(fileName);
                return;
            }
        }
        EmptyFileCreatorFactory::defaultCreator(fileName);
    }